

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

RandomBernoulliDynamicLayerParams * __thiscall
CoreML::Specification::RandomBernoulliDynamicLayerParams::New
          (RandomBernoulliDynamicLayerParams *this,Arena *arena)

{
  RandomBernoulliDynamicLayerParams *this_00;
  
  this_00 = (RandomBernoulliDynamicLayerParams *)operator_new(0x20);
  RandomBernoulliDynamicLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::RandomBernoulliDynamicLayerParams>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

RandomBernoulliDynamicLayerParams* RandomBernoulliDynamicLayerParams::New(::google::protobuf::Arena* arena) const {
  RandomBernoulliDynamicLayerParams* n = new RandomBernoulliDynamicLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}